

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_lnkasi(runtime_type *this,iterator a,var *b)

{
  token_base *ptVar1;
  int iVar2;
  token_base **pptVar3;
  var *pvVar4;
  var *pvVar5;
  runtime_error *prVar6;
  var_id *id;
  runtime_type *this_00;
  undefined1 local_60 [8];
  slot_type *local_58;
  undefined1 local_50 [32];
  iterator a_local;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_28;
  
  a_local.mData = (tree_node *)b;
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(&a_local);
  ptVar1 = *pptVar3;
  iVar2 = (*ptVar1->_vptr_token_base[2])(ptVar1);
  if (iVar2 == 4) {
    id = (var_id *)(ptVar1 + 1);
    pvVar4 = domain_manager::get_var((domain_manager *)&a.mData[1].right,id);
    parse_lnkasi(this,(var *)id,pvVar4);
  }
  else {
    iVar2 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar2 != 3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)local_50,"Unexpected left operand in link assign expression.",
                 (allocator *)&local_58);
      runtime_error::runtime_error(prVar6,(string *)local_50);
      __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (*(int *)&ptVar1[1]._vptr_token_base == 0x28) {
      local_58 = (slot_type *)tree_type<cs::token_base_*>::iterator::left(&a_local);
      parse_expr((runtime_type *)local_50,(iterator *)a.mData,SUB81(&local_58,0));
      local_28.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )tree_type<cs::token_base_*>::iterator::right(&a_local);
      this_00 = (runtime_type *)local_60;
      parse_expr(this_00,(iterator *)a.mData,SUB81(&local_28,0));
      pvVar4 = (var *)local_50;
      pvVar5 = parse_access_lhs(this_00,pvVar4,(var *)local_60);
      parse_lnkasi(this,pvVar4,pvVar5);
      cs_impl::any::recycle((any *)local_60);
    }
    else {
      if (*(int *)&ptVar1[1]._vptr_token_base != 0xe) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)local_50,"Unexpected left operand in link assign expression.",
                   (allocator *)&local_58);
        runtime_error::runtime_error(prVar6,(string *)local_50);
        __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_58 = (slot_type *)tree_type<cs::token_base_*>::iterator::left(&a_local);
      parse_expr((runtime_type *)local_50,(iterator *)a.mData,SUB81(&local_58,0));
      local_60 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(&a_local);
      pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      pvVar4 = (var *)local_50;
      pvVar5 = parse_dot_lhs((runtime_type *)a.mData,pvVar4,*pptVar3);
      parse_lnkasi(this,pvVar4,pvVar5);
    }
    cs_impl::any::recycle((any *)local_50);
  }
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_lnkasi(tree_type<token_base *>::iterator a, const var &b)
	{
		token_base *token = a.data();
		if (token->get_type() == token_types::id)
			return parse_lnkasi(storage.get_var(static_cast<token_id *>(token)->get_id()), b);
		else if (token->get_type() == token_types::signal) {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			case signal_types::dot_:
				return parse_lnkasi(parse_dot_lhs(parse_expr(a.left()), a.right().data()), b);
			case signal_types::access_:
				return parse_lnkasi(parse_access_lhs(parse_expr(a.left()), parse_expr(a.right())), b);
			default:
				throw runtime_error("Unexpected left operand in link assign expression.");
			}
		}
		else
			throw runtime_error("Unexpected left operand in link assign expression.");
	}